

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmm.c
# Opt level: O1

int stmm_find(stmm_table *table,char *key,char ***slot)

{
  stmm_hash_func_type p_Var1;
  stmm_compare_func_type p_Var2;
  int iVar3;
  int iVar4;
  stmm_table_entry *psVar5;
  stmm_table_entry **ppsVar6;
  bool bVar7;
  bool bVar8;
  
  p_Var1 = table->hash;
  if (p_Var1 == stmm_ptrhash) {
    iVar3 = (int)(((ulong)key >> 2) % (ulong)(long)table->num_bins);
  }
  else if (p_Var1 == stmm_numhash) {
    iVar4 = (int)key;
    iVar3 = -iVar4;
    if (0 < iVar4) {
      iVar3 = iVar4;
    }
    iVar3 = iVar3 % table->num_bins;
  }
  else {
    iVar3 = (*p_Var1)(key,table->num_bins);
  }
  psVar5 = table->bins[iVar3];
  bVar7 = psVar5 == (stmm_table_entry *)0x0;
  if (!bVar7) {
    ppsVar6 = table->bins + iVar3;
    do {
      p_Var2 = table->compare;
      if (p_Var2 == stmm_numcmp || p_Var2 == stmm_ptrcmp) {
        bVar8 = psVar5->key == key;
      }
      else {
        iVar4 = (*p_Var2)(key,psVar5->key);
        bVar8 = iVar4 == 0;
      }
      if (bVar8) {
        if (table->reorder_flag != 0) {
          *ppsVar6 = psVar5->next;
          ppsVar6 = table->bins;
          psVar5->next = ppsVar6[iVar3];
          ppsVar6[iVar3] = psVar5;
        }
        if (!bVar7) {
          if (slot != (char ***)0x0) {
            *slot = &psVar5->record;
            return 1;
          }
          return 1;
        }
        return 0;
      }
      ppsVar6 = &psVar5->next;
      bVar7 = psVar5->next == (stmm_table_entry *)0x0;
      psVar5 = psVar5->next;
    } while (!bVar7);
  }
  return 0;
}

Assistant:

int
stmm_find (stmm_table *table, char *key, char ***slot)
{
    int hash_val;
    stmm_table_entry *ptr, **last;

    hash_val = do_hash (key, table);

    FIND_ENTRY (table, hash_val, key, ptr, last);

    if (ptr == NULL) {
    return 0;
    }
    else {
    if (slot != NULL)
    {
        *slot = &ptr->record;
    }
    return 1;
    }
}